

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.h
# Opt level: O2

bool __thiscall
google::protobuf::MessageLite::
ParseFrom<(google::protobuf::MessageLite::ParseFlags)3,google::protobuf::io::ZeroCopyInputStream*>
          (MessageLite *this,ZeroCopyInputStream **input)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ClassDataFull *pCVar3;
  TcParseTableBase *tc_table;
  undefined8 uVar4;
  char *pcVar5;
  undefined8 uStack_30;
  LogMessageFatal local_20 [16];
  ClassData *this_00;
  
  (*this->_vptr_MessageLite[2])();
  iVar2 = (*this->_vptr_MessageLite[4])(this);
  this_00 = (ClassData *)CONCAT44(extraout_var,iVar2);
  if (this_00 == (ClassData *)0x0) {
    pcVar5 = "data != nullptr";
    uStack_30 = 0xf;
    uVar4 = 0x35e;
LAB_00168f21:
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/message_lite.h"
               ,uVar4,uStack_30,pcVar5);
    absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_20);
  }
  tc_table = this_00->tc_table;
  if (tc_table == (TcParseTableBase *)0x0) {
    if (this_00->is_lite == true) {
      pcVar5 = "!data->is_lite";
      uStack_30 = 0xe;
      uVar4 = 0x362;
      goto LAB_00168f21;
    }
    pCVar3 = internal::ClassData::full(this_00);
    tc_table = (*pCVar3->descriptor_methods->get_tc_table)(this);
  }
  bVar1 = internal::MergeFromImpl<false>(*input,this,tc_table,kParsePartial);
  return bVar1;
}

Assistant:

bool MessageLite::ParseFrom(const T& input) {
  if (flags & kParse) Clear();
  constexpr bool alias = (flags & kMergeWithAliasing) != 0;
  const internal::TcParseTableBase* tc_table;
  PROTOBUF_ALWAYS_INLINE_CALL tc_table = GetTcParseTable();
  return internal::MergeFromImpl<alias>(input, this, tc_table, flags);
}